

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::PrintHelpText(CommandLineInterface *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1,
                           " [OPTION] PROTO_FILES\nParse PROTO_FILES and generate output based on the options given:\n  -IPATH, --proto_path=PATH   Specify the directory in which to search for\n                              imports.  May be specified multiple times;\n                              directories will be searched in order.  If not\n                              given, the current working directory is used.\n                              If not found in any of the these directories,\n                              the --descriptor_set_in descriptors will be\n                              checked for required proto file.\n  --version                   Show version info and exit.\n  -h, --help                  Show this text and exit.\n  --encode=MESSAGE_TYPE       Read a text-format message of the given type\n                              from standard input and write it in binary\n                              to standard output.  The message type must\n                              be defined in PROTO_FILES or their imports.\n  --decode=MESSAGE_TYPE       Read a binary message of the given type from\n                              standard input and write it in text format\n                              to standard output.  The message type must\n                              be defined in PROTO_FILES or their imports.\n  --decode_raw                Read an arbitrary protocol message from\n                              standard input and write the raw tag/value\n                              pairs in text format to standard output.  No\n                              PROTO_FILES should be given when using this\n                              flag.\n  --descriptor_set_in=FILES   Specifies a delimited list of FILES\n                              each containing a FileDescriptorSet (a\n                              protocol buffer defined in descriptor.proto).\n                              The FileDescriptor for each of the PROTO_FILES\n                              provided will be loaded from these\n                              FileDescriptorSets. If a FileDes..." /* TRUNCATED STRING LITERAL */
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((this->plugin_prefix_)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "  --plugin=EXECUTABLE         Specifies a plugin executable to use.\n                              Normally, protoc searches the PATH for\n                              plugins, but you may specify additional\n                              executables not in the path using this flag.\n                              Additionally, EXECUTABLE may be of the form\n                              NAME=PATH, in which case the given plugin name\n                              is mapped to the given executable even if\n                              the executable\'s own name differs."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  for (p_Var2 = (this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->generators_by_flag_name_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"  ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,"=OUT_DIR ");
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,'\x13' - (char)p_Var2[1]._M_parent);
    poVar1 = std::operator<<(poVar1,(string *)local_50);
    poVar1 = std::operator<<(poVar1,(string *)&p_Var2[4]._M_parent);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)local_50);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "  @<filename>                 Read options and filenames from file. If a\n                              relative file path is specified, the file\n                              will be searched in the working directory.\n                              The --proto_path option will not affect how\n                              this argument file is searched. Content of\n                              the file will be expanded in the position of\n                              @<filename> as in the argument list. Note\n                              that shell expansion is not applied to the\n                              content of the file (i.e., you cannot use\n                              quotes, wildcards, escapes, commands, etc.).\n                              Each line corresponds to a single argument,\n                              even if it contains spaces."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void CommandLineInterface::PrintHelpText() {
  // Sorry for indentation here; line wrapping would be uglier.
  std::cout
      <<
      "Usage: " << executable_name_
      << " [OPTION] PROTO_FILES\n"
         "Parse PROTO_FILES and generate output based on the options given:\n"
         "  -IPATH, --proto_path=PATH   Specify the directory in which to "
         "search for\n"
         "                              imports.  May be specified multiple "
         "times;\n"
         "                              directories will be searched in order. "
         " If not\n"
         "                              given, the current working directory "
         "is used.\n"
         "                              If not found in any of the these "
         "directories,\n"
         "                              the --descriptor_set_in descriptors "
         "will be\n"
         "                              checked for required proto file.\n"
         "  --version                   Show version info and exit.\n"
         "  -h, --help                  Show this text and exit.\n"
         "  --encode=MESSAGE_TYPE       Read a text-format message of the "
         "given type\n"
         "                              from standard input and write it in "
         "binary\n"
         "                              to standard output.  The message type "
         "must\n"
         "                              be defined in PROTO_FILES or their "
         "imports.\n"
         "  --decode=MESSAGE_TYPE       Read a binary message of the given "
         "type from\n"
         "                              standard input and write it in text "
         "format\n"
         "                              to standard output.  The message type "
         "must\n"
         "                              be defined in PROTO_FILES or their "
         "imports.\n"
         "  --decode_raw                Read an arbitrary protocol message "
         "from\n"
         "                              standard input and write the raw "
         "tag/value\n"
         "                              pairs in text format to standard "
         "output.  No\n"
         "                              PROTO_FILES should be given when using "
         "this\n"
         "                              flag.\n"
         "  --descriptor_set_in=FILES   Specifies a delimited list of FILES\n"
         "                              each containing a FileDescriptorSet "
         "(a\n"
         "                              protocol buffer defined in "
         "descriptor.proto).\n"
         "                              The FileDescriptor for each of the "
         "PROTO_FILES\n"
         "                              provided will be loaded from these\n"
         "                              FileDescriptorSets. If a "
         "FileDescriptor\n"
         "                              appears multiple times, the first "
         "occurrence\n"
         "                              will be used.\n"
         "  -oFILE,                     Writes a FileDescriptorSet (a protocol "
         "buffer,\n"
         "    --descriptor_set_out=FILE defined in descriptor.proto) "
         "containing all of\n"
         "                              the input files to FILE.\n"
         "  --include_imports           When using --descriptor_set_out, also "
         "include\n"
         "                              all dependencies of the input files in "
         "the\n"
         "                              set, so that the set is "
         "self-contained.\n"
         "  --include_source_info       When using --descriptor_set_out, do "
         "not strip\n"
         "                              SourceCodeInfo from the "
         "FileDescriptorProto.\n"
         "                              This results in vastly larger "
         "descriptors that\n"
         "                              include information about the "
         "original\n"
         "                              location of each decl in the source "
         "file as\n"
         "                              well as surrounding comments.\n"
         "  --dependency_out=FILE       Write a dependency output file in the "
         "format\n"
         "                              expected by make. This writes the "
         "transitive\n"
         "                              set of input file paths to FILE\n"
         "  --error_format=FORMAT       Set the format in which to print "
         "errors.\n"
         "                              FORMAT may be 'gcc' (the default) or "
         "'msvs'\n"
         "                              (Microsoft Visual Studio format).\n"
         "  --print_free_field_numbers  Print the free field numbers of the "
         "messages\n"
         "                              defined in the given proto files. "
         "Groups share\n"
         "                              the same field number space with the "
         "parent \n"
         "                              message. Extension ranges are counted "
         "as \n"
         "                              occupied fields numbers.\n"
      << std::endl;
  if (!plugin_prefix_.empty()) {
    std::cout
        << "  --plugin=EXECUTABLE         Specifies a plugin executable to "
           "use.\n"
           "                              Normally, protoc searches the PATH "
           "for\n"
           "                              plugins, but you may specify "
           "additional\n"
           "                              executables not in the path using "
           "this flag.\n"
           "                              Additionally, EXECUTABLE may be of "
           "the form\n"
           "                              NAME=PATH, in which case the given "
           "plugin name\n"
           "                              is mapped to the given executable "
           "even if\n"
           "                              the executable's own name differs."
        << std::endl;
  }

  for (GeneratorMap::iterator iter = generators_by_flag_name_.begin();
       iter != generators_by_flag_name_.end(); ++iter) {
    // FIXME(kenton):  If the text is long enough it will wrap, which is ugly,
    //   but fixing this nicely (e.g. splitting on spaces) is probably more
    //   trouble than it's worth.
    std::cout << "  " << iter->first << "=OUT_DIR "
              << std::string(19 - iter->first.size(),
                             ' ')  // Spaces for alignment.
              << iter->second.help_text << std::endl;
  }
  std::cout << "  @<filename>                 Read options and filenames from "
               "file. If a\n"
               "                              relative file path is specified, "
               "the file\n"
               "                              will be searched in the working "
               "directory.\n"
               "                              The --proto_path option will not "
               "affect how\n"
               "                              this argument file is searched. "
               "Content of\n"
               "                              the file will be expanded in the "
               "position of\n"
               "                              @<filename> as in the argument "
               "list. Note\n"
               "                              that shell expansion is not "
               "applied to the\n"
               "                              content of the file (i.e., you "
               "cannot use\n"
               "                              quotes, wildcards, escapes, "
               "commands, etc.).\n"
               "                              Each line corresponds to a "
               "single argument,\n"
               "                              even if it contains spaces."
            << std::endl;
}